

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O3

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::lower_bound<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  _Cat _Var1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  
  pbVar2 = bits::
           lower_bound<5ul,std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)(this + 8),key,
                      (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)this);
  if ((pbVar2 != (basic_string_view<char,_std::char_traits<char>_> *)(this + 0x58)) &&
     (__x._M_len = key->_M_len, __x._M_str = key->_M_str, __y._M_len = pbVar2->_M_len,
     __y._M_str = pbVar2->_M_str, _Var1 = std::operator<=><char,std::char_traits<char>>(__x,__y),
     -1 < _Var1._M_value)) {
    return pbVar2;
  }
  return (basic_string_view<char,_std::char_traits<char>_> *)(this + 0x58);
}

Assistant:

constexpr const_iterator lower_bound(KeyType const &key) const {
    auto const where = bits::lower_bound<N>(keys_.begin(), key, less_than_);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }